

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::IfnDefGuardTest_DifferentDelim_Test::
~IfnDefGuardTest_DifferentDelim_Test(IfnDefGuardTest_DifferentDelim_Test *this)

{
  IfnDefGuardTest_DifferentDelim_Test *this_local;
  
  ~IfnDefGuardTest_DifferentDelim_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(IfnDefGuardTest, DifferentDelim) {
  {
    io::Printer printer(output(), '\0');

    const IfdefGuardPrinter ifdef_guard(&printer, "A/B/E/alpha");

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "#ifndef A_B_E_ALPHA_\n"
            "#define A_B_E_ALPHA_\n"
            "\n"
            "\n"
            "#endif  // A_B_E_ALPHA_\n");
}